

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void cpu_mips_store_status_mips64(CPUMIPSState_conflict5 *env,target_ulong val)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  CPUState *cpu;
  uint uVar4;
  uint32_t ksux;
  _Bool has_supervisor;
  target_ulong old;
  uint uStack_18;
  uint32_t mask;
  target_ulong val_local;
  CPUMIPSState_conflict5 *env_local;
  
  uVar4 = (uint)val;
  old._4_4_ = env->CP0_Status_rw_bitmask;
  uVar1 = env->CP0_Status;
  uStack_18 = uVar4;
  if ((env->insn_flags & 0x2000) != 0) {
    uVar3 = extract32(old._4_4_,3,2);
    uVar2 = (uVar4 & 0x80) >> 1 | 0x80;
    uStack_18 = uVar4 & (uVar2 | (uVar4 & uVar2) >> 1 | 0xffffff1f);
    if (uVar3 == 3) {
      uVar3 = extract32(uStack_18,3,2);
      if (uVar3 == 3) {
        old._4_4_ = old._4_4_ & 0xffffffe7;
      }
    }
    old._4_4_ = old._4_4_ & (uVar4 & 0x180000 ^ 0xffffffff);
  }
  env->CP0_Status = uVar1 & (old._4_4_ ^ 0xffffffff) | uStack_18 & old._4_4_;
  if (((env->CP0_Status ^ uVar1) & uVar1 & 0xe0) != 0) {
    cpu = env_cpu(env);
    tlb_flush_mips64(cpu);
  }
  if ((env->CP0_Config3 & 4U) == 0) {
    compute_hflags(env);
  }
  else {
    sync_c0_status_mips64(env,env,env->current_tc);
  }
  return;
}

Assistant:

void cpu_mips_store_status(CPUMIPSState *env, target_ulong val)
{
    uint32_t mask = env->CP0_Status_rw_bitmask;
    target_ulong old = env->CP0_Status;

    if (env->insn_flags & ISA_MIPS32R6) {
        bool has_supervisor = extract32(mask, CP0St_KSU, 2) == 0x3;
#if defined(TARGET_MIPS64)
        uint32_t ksux = (1 << CP0St_KX) & val;
        ksux |= (ksux >> 1) & val; /* KX = 0 forces SX to be 0 */
        ksux |= (ksux >> 1) & val; /* SX = 0 forces UX to be 0 */
        val = (val & ~(7 << CP0St_UX)) | ksux;
#endif
        if (has_supervisor && extract32(val, CP0St_KSU, 2) == 0x3) {
            mask &= ~(3 << CP0St_KSU);
        }
        mask &= ~(((1 << CP0St_SR) | (1 << CP0St_NMI)) & val);
    }

    env->CP0_Status = (old & ~mask) | (val & mask);
#if defined(TARGET_MIPS64)
    if ((env->CP0_Status ^ old) & (old & (7 << CP0St_UX))) {
        /* Access to at least one of the 64-bit segments has been disabled */
        tlb_flush(env_cpu(env));
    }
#endif
    if (env->CP0_Config3 & (1 << CP0C3_MT)) {
        sync_c0_status(env, env, env->current_tc);
    } else {
        compute_hflags(env);
    }
}